

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_34;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  lVar10 = 0;
  ZSTD_getCParamsFromCCtxParams(&local_34,params,0xffffffffffffffff,0);
  uVar5 = 1L << ((byte)local_34.windowLog & 0x3f);
  if (0x1ffff < uVar5) {
    uVar5 = 0x20000;
  }
  uVar6 = 0x11;
  if (local_34.windowLog < 0x11) {
    uVar6 = local_34.windowLog;
  }
  if (local_34.minMatch != 3) {
    uVar6 = 0;
  }
  lVar7 = 4L << ((byte)local_34.chainLog & 0x3f);
  if (local_34.strategy == ZSTD_fast) {
    lVar7 = lVar10;
  }
  lVar9 = 0x24608;
  if ((int)local_34.strategy < 7) {
    lVar9 = lVar10;
  }
  lVar8 = 4L << ((byte)uVar6 & 0x3f);
  if (uVar6 == 0) {
    lVar8 = lVar10;
  }
  uVar6 = (params->ldmParams).hashLog;
  uVar1 = (params->ldmParams).bucketSizeLog;
  bVar2 = (byte)uVar6;
  bVar4 = bVar2 - (char)uVar1;
  if (uVar6 < uVar1) {
    bVar4 = 0;
  }
  lVar3 = lVar10;
  if ((params->ldmParams).enableLdm != 0) {
    lVar10 = (uVar5 / (params->ldmParams).minMatchLength) * 0xc;
    lVar3 = (8L << (bVar2 & 0x3f)) + (1L << (bVar4 & 0x3f));
  }
  return lVar10 + uVar5 + lVar9 + lVar8 + lVar7 + (4L << ((byte)local_34.hashLog & 0x3f)) + lVar3 +
                  (uVar5 / ((ulong)(local_34.minMatch != 3) + 3)) * 0xb + 0x4088;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
        size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq));

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;
        size_t const cctxSpace = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx));

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)cctxSpace);
        DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
        return cctxSpace + neededSpace;
    }
}